

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.hpp
# Opt level: O0

DataType csv::internals::data_type(string_view in,longdouble *out,char decimalSymbol)

{
  char cVar1;
  DataType DVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint *n;
  longdouble *in_R8;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar6;
  string_view exponential_part;
  DataType local_ec;
  longdouble local_e8;
  longdouble local_d0;
  undefined1 auStack_b8 [8];
  longdouble number;
  short local_9a;
  undefined1 auStack_98 [6];
  short digit;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_type local_78;
  size_t exponent_start_idx;
  char *current;
  size_t ilen;
  size_t i;
  longdouble decimal_part;
  longdouble integral_part;
  int local_34;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  uint places_after_decimal;
  bool prob_float;
  bool has_digit;
  bool is_negative;
  bool digit_allowed;
  bool dot_allowed;
  bool ws_allowed;
  longdouble *plStack_28;
  char decimalSymbol_local;
  longdouble *out_local;
  string_view in_local;
  
  in_local._M_len = (size_t)in._M_str;
  out_local = (longdouble *)in._M_len;
  places_after_decimal._3_1_ = decimalSymbol;
  plStack_28 = out;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
  if (sVar4 == 0) {
    in_local._M_str._4_4_ = CSV_NULL;
  }
  else {
    places_after_decimal._2_1_ = 1;
    places_after_decimal._1_1_ = 1;
    places_after_decimal._0_1_ = 1;
    local_2d = 0;
    local_2e = 0;
    local_2f = 0;
    local_34 = 0;
    _i = (longdouble)0;
    ilen = 0;
    lVar6 = in_ST5;
    unique0x1000037e = _i;
    current = (char *)std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)&out_local);
    for (; ilen < current; ilen = ilen + 1) {
      n = (uint *)ilen;
      exponent_start_idx =
           (size_t)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,ilen);
      cVar1 = *(char *)exponent_start_idx;
      if (cVar1 == ' ') {
        if ((places_after_decimal._2_1_ & 1) == 0) {
          pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,
                              ilen - 1);
          iVar3 = isdigit((int)*pvVar5);
          if (iVar3 == 0) {
            return CSV_STRING;
          }
          places_after_decimal._0_1_ = 0;
          places_after_decimal._2_1_ = 1;
        }
      }
      else if (cVar1 == '+') {
        if ((places_after_decimal._2_1_ & 1) == 0) {
          return CSV_STRING;
        }
      }
      else if (cVar1 == '-') {
        if ((places_after_decimal._2_1_ & 1) == 0) {
          return CSV_STRING;
        }
        local_2d = 1;
      }
      else {
        if ((cVar1 == 'E') || (cVar1 == 'e')) {
          if ((local_2f & 1) == 0) {
            if ((ilen != 0) && ((char *)(ilen + 1) < current)) {
              pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,
                                  ilen - 1);
              iVar3 = isdigit((int)*pvVar5);
              if (iVar3 != 0) goto LAB_0011f38b;
            }
            return CSV_STRING;
          }
LAB_0011f38b:
          local_78 = ilen + 1;
          local_2f = 1;
          pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,
                              ilen + 1);
          if (*pvVar5 == '+') {
            local_78 = local_78 + 1;
          }
          local_88 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)&out_local,
                                local_78,0xffffffffffffffff);
          if ((local_2d & 1) == 0) {
            local_d0 = _i + stack0xffffffffffffffb8;
          }
          else {
            local_d0 = -(_i + stack0xffffffffffffffb8);
          }
          _auStack_98 = local_d0;
          exponential_part._M_str = auStack_98;
          exponential_part._M_len = (size_t)local_88._M_str;
          DVar2 = _process_potential_exponential
                            ((internals *)local_88._M_len,exponential_part,plStack_28,in_R8);
          return DVar2;
        }
        local_9a = *(char *)exponent_start_idx + -0x30;
        if ((local_9a < 0) || (9 < local_9a)) {
          if (((places_after_decimal._1_1_ & 1) == 0) ||
             (*(char *)exponent_start_idx != places_after_decimal._3_1_)) {
            return CSV_STRING;
          }
          places_after_decimal._1_1_ = 0;
          local_2f = 1;
        }
        else {
          local_2e = 1;
          if (((byte)places_after_decimal & 1) == 0) {
            return CSV_STRING;
          }
          if ((places_after_decimal._2_1_ & 1) != 0) {
            places_after_decimal._2_1_ = 0;
          }
          if ((local_2f & 1) == 0) {
            register0x00001110 =
                 (longdouble)(int)local_9a + (longdouble)10.0 * stack0xffffffffffffffb8;
            in_ST5 = in_ST4;
            lVar6 = in_ST4;
          }
          else {
            iVar3 = (int)local_9a;
            local_34 = local_34 + 1;
            pow10<unsigned_int>((longdouble *)&local_34,n);
            _i = _i + (longdouble)iVar3 / in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = lVar6;
          }
        }
      }
    }
    if ((local_2e & 1) == 0) {
      in_local._M_str._4_4_ = CSV_NULL;
    }
    else {
      _auStack_b8 = _i + stack0xffffffffffffffb8;
      if (plStack_28 != (longdouble *)0x0) {
        local_e8 = _auStack_b8;
        if ((local_2d & 1) != 0) {
          local_e8 = -_auStack_b8;
        }
        *plStack_28 = local_e8;
      }
      if ((local_2f & 1) == 0) {
        local_ec = _determine_integral_type((longdouble *)auStack_b8);
      }
      else {
        local_ec = CSV_DOUBLE;
      }
      in_local._M_str._4_4_ = local_ec;
    }
  }
  return in_local._M_str._4_4_;
}

Assistant:

CONSTEXPR_14
        DataType data_type(csv::string_view in, long double* const out, const char decimalSymbol) {
            // Empty string --> NULL
            if (in.size() == 0)
                return DataType::CSV_NULL;

            bool ws_allowed = true,
                dot_allowed = true,
                digit_allowed = true,
                is_negative = false,
                has_digit = false,
                prob_float = false;

            unsigned places_after_decimal = 0;
            long double integral_part = 0,
                decimal_part = 0;

            for (size_t i = 0, ilen = in.size(); i < ilen; i++) {
                const char& current = in[i];

                switch (current) {
                case ' ':
                    if (!ws_allowed) {
                        if (isdigit(in[i - 1])) {
                            digit_allowed = false;
                            ws_allowed = true;
                        }
                        else {
                            // Ex: '510 123 4567'
                            return DataType::CSV_STRING;
                        }
                    }
                    break;
                case '+':
                    if (!ws_allowed) {
                        return DataType::CSV_STRING;
                    }

                    break;
                case '-':
                    if (!ws_allowed) {
                        // Ex: '510-123-4567'
                        return DataType::CSV_STRING;
                    }

                    is_negative = true;
                    break;
                // case decimalSymbol: not allowed because decimalSymbol is not a literal,
                // it is handled in the default block
                case 'e':
                case 'E':
                    // Process scientific notation
                    if (prob_float || (i && i + 1 < ilen && isdigit(in[i - 1]))) {
                        size_t exponent_start_idx = i + 1;
                        prob_float = true;

                        // Strip out plus sign
                        if (in[i + 1] == '+') {
                            exponent_start_idx++;
                        }

                        return _process_potential_exponential(
                            in.substr(exponent_start_idx),
                            is_negative ? -(integral_part + decimal_part) : integral_part + decimal_part,
                            out
                        );
                    }

                    return DataType::CSV_STRING;
                    break;
                default:
                    short digit = static_cast<short>(current - '0');
                    if (digit >= 0 && digit <= 9) {
                        // Process digit
                        has_digit = true;

                        if (!digit_allowed)
                            return DataType::CSV_STRING;
                        else if (ws_allowed) // Ex: '510 456'
                            ws_allowed = false;

                        // Build current number
                        if (prob_float)
                            decimal_part += digit / pow10(++places_after_decimal);
                        else
                            integral_part = (integral_part * 10) + digit;
                    }
                    // case decimalSymbol: not allowed because decimalSymbol is not a literal. 
                    else if (dot_allowed && current == decimalSymbol) {
                        dot_allowed = false;
                        prob_float = true;
                    }
                    else {
                        return DataType::CSV_STRING;
                    }
                }
            }

            // No non-numeric/non-whitespace characters found
            if (has_digit) {
                long double number = integral_part + decimal_part;
                if (out) {
                    *out = is_negative ? -number : number;
                }

                return prob_float ? DataType::CSV_DOUBLE : _determine_integral_type(number);
            }

            // Just whitespace
            return DataType::CSV_NULL;
        }